

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
::swap(btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
       *this,btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             *x)

{
  bool bVar1;
  allocator_type *paVar2;
  allocator_type *paVar3;
  node_type **__a;
  node_type **__b;
  key_compare *__a_00;
  key_compare *__b_00;
  btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
  *x_local;
  btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
  *this_local;
  
  paVar2 = allocator(this);
  paVar3 = allocator(x);
  bVar1 = std::operator==(paVar2,paVar3);
  if (!bVar1) {
    __assert_fail("allocator() == x.allocator()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb3b,
                  "void phmap::priv::btree<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>>::swap(btree<Params> &) [Params = phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>]"
                 );
  }
  __a = mutable_root(this);
  __b = mutable_root(x);
  std::
  swap<phmap::priv::btree_node<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>*>
            (__a,__b);
  __a_00 = mutable_key_comp(this);
  __b_00 = mutable_key_comp(x);
  std::swap<phmap::Less<long>>(__a_00,__b_00);
  std::
  swap<phmap::priv::btree_node<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>*>
            (&this->rightmost_,&x->rightmost_);
  std::swap<unsigned_long>(&this->size_,&x->size_);
  return;
}

Assistant:

void btree<P>::swap(btree &x) {
        using std::swap;
        if (phmap::allocator_traits<
            allocator_type>::propagate_on_container_swap::value) {
            // Note: `root_` also contains the allocator and the key comparator.
            swap(root_, x.root_);
        } else {
            // It's undefined behavior if the allocators are unequal here.
            assert(allocator() == x.allocator());
            swap(mutable_root(), x.mutable_root());
            swap(*mutable_key_comp(), *x.mutable_key_comp());
        }
        swap(rightmost_, x.rightmost_);
        swap(size_, x.size_);
    }